

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::iterate(TexelFetchTest *this)

{
  int iVar1;
  TEST_CASES TVar2;
  GLenum GVar3;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar6;
  undefined4 extraout_var_02;
  bool bVar7;
  char *pcVar8;
  GLint level;
  qpTestResult testResult;
  TestContext *this_00;
  char *__end;
  GLint max_image_samples;
  GLint max_integer_samples;
  Texture destination_texture;
  Texture source_texture;
  VertexArray vao;
  Framebuffer framebuffer;
  Program valid_program;
  Program invalid_program;
  GLenum local_398;
  string local_390;
  string local_370;
  string local_350;
  Texture local_330;
  Texture local_320;
  string local_310;
  VertexArray local_2f0;
  Framebuffer local_2e0;
  string local_2d0;
  string local_2b0;
  Program local_290;
  Program local_220;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  TVar2 = this->m_test_case;
  if ((int)TVar2 < 5) {
    bVar7 = true;
    do {
      if (TVar2 - RG8_SNORM < 2) {
        TVar2 = TVar2 + RG8_SNORM;
        this->m_test_case = TVar2;
      }
      else {
        local_330.m_context = (this->super_TestCase).m_context;
        local_330.m_id = 0xffffffff;
        local_2e0.m_id = 0xffffffff;
        local_220.m_id = 0;
        local_220.m_compute.m_id = 0;
        local_220.m_fragment.m_id = 0;
        local_220.m_geometry.m_id = 0;
        local_220.m_tess_ctrl.m_id = 0;
        local_220.m_tess_eval.m_id = 0;
        local_220.m_vertex.m_id = 0;
        local_320.m_id = 0xffffffff;
        local_290.m_id = 0;
        local_290.m_compute.m_id = 0;
        local_290.m_fragment.m_id = 0;
        local_290.m_geometry.m_id = 0;
        local_290.m_tess_ctrl.m_id = 0;
        local_290.m_tess_eval.m_id = 0;
        local_290.m_vertex.m_id = 0;
        local_2f0.m_id = 0xffffffff;
        local_320.m_context = local_330.m_context;
        local_2f0.m_context = local_330.m_context;
        local_2e0.m_context = local_330.m_context;
        local_290.m_compute.m_context = local_330.m_context;
        local_290.m_fragment.m_context = local_330.m_context;
        local_290.m_geometry.m_context = local_330.m_context;
        local_290.m_tess_ctrl.m_context = local_330.m_context;
        local_290.m_tess_eval.m_context = local_330.m_context;
        local_290.m_vertex.m_context = local_330.m_context;
        local_290.m_context = local_330.m_context;
        local_220.m_compute.m_context = local_330.m_context;
        local_220.m_fragment.m_context = local_330.m_context;
        local_220.m_geometry.m_context = local_330.m_context;
        local_220.m_tess_ctrl.m_context = local_330.m_context;
        local_220.m_tess_eval.m_context = local_330.m_context;
        local_220.m_vertex.m_context = local_330.m_context;
        local_220.m_context = local_330.m_context;
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_2b0,this,0)
        ;
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_2d0,this,1)
        ;
        VertexArray::Generate(gl,&local_2f0.m_id);
        (*gl->bindVertexArray)(local_2f0.m_id);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"BindVertexArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x3d1);
        RobustBufferAccessBehavior::Texture::Generate(gl,&local_330.m_id);
        RobustBufferAccessBehavior::Texture::Generate(gl,&local_320.m_id);
        if (this->m_test_case == R32UI_MULTISAMPLE) {
          (*gl->getIntegerv)(0x9110,(GLint *)&local_350);
          (*gl->getIntegerv)(0x906d,(GLint *)&local_390);
          if ((3 < (int)local_350._M_dataplus._M_p) && (3 < (int)local_390._M_dataplus._M_p))
          goto LAB_00d919c5;
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Test case: ",0xb)
          ;
          iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
          pcVar8 = (char *)CONCAT44(extraout_var_00,iVar1);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)local_1a8 + (int)*(_func_int **)((long)local_1a8 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," not supported",0xe);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d92161:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
LAB_00d919c5:
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                    (this,0,(ulong)local_330.m_id);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                    (this,1,(ulong)local_320.m_id);
          local_398 = 0xde1;
          if (this->m_test_case == R32UI_MIPMAP) {
            level = 1;
          }
          else {
            level = 0;
            if (this->m_test_case == R32UI_MULTISAMPLE) {
              local_398 = 0x9100;
              level = 0;
            }
          }
          RobustBufferAccessBehavior::Framebuffer::Generate(gl,&local_2e0.m_id);
          (*gl->bindFramebuffer)(0x8ca9,local_2e0.m_id);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"BindFramebuffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x111);
          RobustBufferAccessBehavior::Framebuffer::AttachTexture
                    (gl,0x8ca9,0x8ce0,local_330.m_id,level,0x10,0x10);
          local_1b0 = (undefined1  [8])(local_1a8 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1af8059,0x1af8059);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this)
          ;
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,0x1af8059,0x1af8059);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,0x1af8059,0x1af8059);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this)
          ;
          RobustBufferAccessBehavior::Program::Init
                    (&local_290,(string *)local_1b0,&local_2d0,&local_350,&local_390,&local_370,
                     &local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_350._M_dataplus._M_p._4_4_,(int)local_350._M_dataplus._M_p) !=
              &local_350.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_350._M_dataplus._M_p._4_4_,
                                     (int)local_350._M_dataplus._M_p),
                            local_350.field_2._M_allocated_capacity + 1);
          }
          if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
            operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
          }
          local_1b0 = (undefined1  [8])(local_1a8 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1af8059,0x1af8059);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this)
          ;
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,0x1af8059,0x1af8059);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,0x1af8059,0x1af8059);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this)
          ;
          RobustBufferAccessBehavior::Program::Init
                    (&local_220,(string *)local_1b0,&local_2b0,&local_350,&local_390,&local_370,
                     &local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_350._M_dataplus._M_p._4_4_,(int)local_350._M_dataplus._M_p) !=
              &local_350.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_350._M_dataplus._M_p._4_4_,
                                     (int)local_350._M_dataplus._M_p),
                            local_350.field_2._M_allocated_capacity + 1);
          }
          if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
            operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
          }
          (*gl->useProgram)(local_290.m_id);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"UseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x1db);
          (*gl->activeTexture)(0x84c0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"ActiveTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x588);
          (*gl->bindTexture)(local_398,local_320.m_id);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"BindTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x28b);
          (*gl->uniform1i)(0,0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"Uniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x58b);
          GVar3 = (*gl->checkFramebufferStatus)(0x8ca9);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"CheckFramebufferStatus",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x58f);
          if (GVar3 != 0x8cd5) {
            local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Test case: ",0xb);
            iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
            pcVar8 = (char *)CONCAT44(extraout_var_02,iVar1);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(_func_int **)((long)local_1a8 + -0x18));
            }
            else {
              sVar6 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," not supported",0xe);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00d92161;
          }
          if (this->m_test_case == R32UI_MULTISAMPLE) {
            (*gl->enable)(0x809d);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"Enable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                            ,0x59c);
          }
          (*gl->drawArrays)(0,0,1);
          GVar3 = (*gl->getError)();
          if (this->m_test_case == R32UI_MULTISAMPLE) {
            (*gl->disable)(0x809d);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"Disable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                            ,0x5a9);
          }
          glu::checkError(GVar3,"DrawArrays",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5ad);
          iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                            (this,(ulong)local_330.m_id);
          (*gl->useProgram)(local_220.m_id);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"UseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x1db);
          (*gl->activeTexture)(0x84c0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"ActiveTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5bc);
          (*gl->bindTexture)(local_398,local_320.m_id);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"BindTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x28b);
          (*gl->uniform1i)(0,0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"Uniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5bf);
          (*gl->drawArrays)(0,0,1);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"DrawArrays",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5c8);
          iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
          if ((byte)((byte)iVar1 & (byte)iVar5) == 0) {
            local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Test case: ",0xb);
            iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
            pcVar8 = (char *)CONCAT44(extraout_var_01,iVar1);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(_func_int **)((long)local_1a8 + -0x18));
            }
            else {
              sVar6 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," failed",7);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar7 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        VertexArray::Release(&local_2f0);
        RobustBufferAccessBehavior::Program::~Program(&local_290);
        RobustBufferAccessBehavior::Texture::~Texture(&local_320);
        RobustBufferAccessBehavior::Program::~Program(&local_220);
        RobustBufferAccessBehavior::Framebuffer::~Framebuffer(&local_2e0);
        RobustBufferAccessBehavior::Texture::~Texture(&local_330);
        TVar2 = this->m_test_case;
      }
      TVar2 = TVar2 + RG8_SNORM;
      this->m_test_case = TVar2;
    } while ((int)TVar2 < 5);
    if (!bVar7) {
      this_00 = ((this->super_TestCase).m_context)->m_testCtx;
      pcVar8 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00d922d5;
    }
  }
  this_00 = ((this->super_TestCase).m_context)->m_testCtx;
  pcVar8 = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d922d5:
  tcu::TestContext::setTestResult(this_00,testResult,pcVar8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TexelFetchTest::iterate()
{
	/* Constants */
	static const GLuint height = 16;
	static const GLuint width  = 16;

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	for (; m_test_case < LAST; m_test_case = (TEST_CASES)((GLuint)m_test_case + 1))
	{
		bool   case_result	= true;
		GLint  level		  = 0;
		GLenum texture_target = GL_TEXTURE_2D;

		if (R32UI_MULTISAMPLE == m_test_case || RG8_SNORM == m_test_case)
		{
			// 1. RG8_SNORM case:
			// Skip RG8_SNORM format case.
			// RG8_SNORM is not required to be used as a render target
			// OpenGL 4.5 Core Spec, Page 197
			//
			// 2. R32UI_MULTISAMPLE case
			// Skip test in multi sample case
			// texelFetch with invalid lod plane results undefined value
			// OpenGL 4.5 Core Spec, around page 377
			m_test_case = (TEST_CASES)((GLuint)m_test_case + 1);
			continue;
		}

		/* */
		Texture		destination_texture(m_context);
		Framebuffer framebuffer(m_context);
		Program		invalid_program(m_context);
		Texture		source_texture(m_context);
		Program		valid_program(m_context);
		VertexArray vao(m_context);

		const std::string& fs_invalid = getFragmentShader(false);
		const std::string& fs_valid   = getFragmentShader(true);

		/* Prepare VAO */
		VertexArray::Generate(gl, vao.m_id);
		VertexArray::Bind(gl, vao.m_id);

		/* Prepare textures */
		Texture::Generate(gl, destination_texture.m_id);
		Texture::Generate(gl, source_texture.m_id);

		if (R32UI_MULTISAMPLE == m_test_case)
		{
			GLint max_integer_samples;
			gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &max_integer_samples);
			GLint max_image_samples;
			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			if (max_integer_samples < 4 || max_image_samples < 4)
			{
				/* prepareTexture() hard-codes 4 samples (n_levels) for
				 * R32UI_MULTISAMPLE case. This value exceeds the required
				 * min-max value (1 in OpenGL ES 3.2) and is not supported
				 * by all implementations.
				 *
				 * Also, the test uses a compute shader with images
				 * to upload the texture so max_image_samples >= 4
				 * is also required.
				 */
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
													<< " not supported" << tcu::TestLog::EndMessage;

				continue;
			}
		}

		prepareTexture(false, destination_texture.m_id);
		prepareTexture(true, source_texture.m_id);

		/* Select FBO settings */
		if (R32UI_MIPMAP == m_test_case)
		{
			level = 1;
		}
		else if (R32UI_MULTISAMPLE == m_test_case)
		{
			texture_target = GL_TEXTURE_2D_MULTISAMPLE;
		}

		/* Prepare FBO */
		Framebuffer::Generate(gl, framebuffer.m_id);
		Framebuffer::Bind(gl, GL_DRAW_FRAMEBUFFER, framebuffer.m_id);
		Framebuffer::AttachTexture(gl, GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, destination_texture.m_id, level,
								   width, height);

		/* Prepare programs */
		valid_program.Init("" /* cs */, fs_valid, getGeometryShader(), "" /* tcs */, "" /* tes */, getVertexShader());
		invalid_program.Init("" /* cs */, fs_invalid, getGeometryShader(), "" /* tcs */, "" /* tes */,
							 getVertexShader());

		/* Test valid case */
		/* Set program */
		Program::Use(gl, valid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Check if setup is supported */
		GLenum fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CheckFramebufferStatus");
		if (GL_FRAMEBUFFER_COMPLETE != fbo_status)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " not supported" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Enable multisampling */
		if (R32UI_MULTISAMPLE == m_test_case)
		{
			gl.enable(GL_MULTISAMPLE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");
		}

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Disable multisampling */
			if (R32UI_MULTISAMPLE == m_test_case)
			{
				gl.disable(GL_MULTISAMPLE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");
			}

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyValidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Test invalid case */
		/* Set program */
		Program::Use(gl, invalid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyInvalidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Set test result */
		if (false == case_result)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " failed" << tcu::TestLog::EndMessage;

			test_result = false;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}